

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrangeInternal
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  LogMessage *pLVar1;
  LogFinisher local_69;
  LogMessage local_68;
  
  if ((this->super_RepeatedPtrFieldBase).arena_ != (Arena *)0x0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x5ac);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: GetArena() == nullptr: ");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,"ExtractSubrange() when arena is non-nullptr is only supported when "
                       );
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,"the Element type supplies a MergeFrom() operation to make copies.");
    internal::LogFinisher::operator=(&local_69,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  UnsafeArenaExtractSubrange(this,start,num,elements);
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrangeInternal(
    int start, int num, Element** elements, std::false_type) {
  // This case is identical to UnsafeArenaExtractSubrange(). However, since
  // ExtractSubrange() must return heap-allocated objects by contract, and we
  // cannot fulfill this contract if we are an on arena, we must GOOGLE_DCHECK() that
  // we are not on an arena.
  GOOGLE_DCHECK(GetArena() == nullptr)
      << "ExtractSubrange() when arena is non-nullptr is only supported when "
      << "the Element type supplies a MergeFrom() operation to make copies.";
  UnsafeArenaExtractSubrange(start, num, elements);
}